

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnData::FetchUpdateRow
          (ColumnData *this,TransactionData transaction,row_t row_id,Vector *result,idx_t result_idx
          )

{
  pointer this_00;
  unsigned_long row_id_00;
  
  ::std::mutex::lock(&this->update_lock);
  if ((this->updates).
      super_unique_ptr<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>_>._M_t.
      super___uniq_ptr_impl<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::UpdateSegment_*,_std::default_delete<duckdb::UpdateSegment>_>.
      super__Head_base<0UL,_duckdb::UpdateSegment_*,_false>._M_head_impl != (UpdateSegment *)0x0) {
    this_00 = unique_ptr<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>,_true>::
              operator->(&this->updates);
    row_id_00 = NumericCastImpl<unsigned_long,_long,_false>::Convert(row_id);
    UpdateSegment::FetchRow(this_00,transaction,row_id_00,result,result_idx);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->update_lock);
  return;
}

Assistant:

void ColumnData::FetchUpdateRow(TransactionData transaction, row_t row_id, Vector &result, idx_t result_idx) {
	lock_guard<mutex> update_guard(update_lock);
	if (!updates) {
		return;
	}
	updates->FetchRow(transaction, NumericCast<idx_t>(row_id), result, result_idx);
}